

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualConstraintViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 *puVar11;
  int iVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  Item *pIVar16;
  cpp_dec_float<100U,_int,_void> *pcVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  solu;
  cpp_dec_float<100U,_int,_void> local_198;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  int iStack_108;
  bool bStack_104;
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  uint local_c8 [3];
  undefined3 uStack_bb;
  int iStack_b8;
  bool bStack_b4;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78 [3];
  undefined3 uStack_6b;
  int iStack_68;
  bool bStack_64;
  undefined8 local_60;
  cpp_dec_float<100U,_int,_void> *local_50;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_48;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_50 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_48,
               (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x60])(this,&local_48);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar15 = 0;
    do {
      pIVar16 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar15].idx;
      local_100._0_4_ = cpp_dec_float_finite;
      local_100._4_4_ = 0x10;
      local_148 = (undefined1  [16])0x0;
      local_138 = (undefined1  [16])0x0;
      local_128 = (undefined1  [16])0x0;
      local_118[0] = 0;
      local_118[1] = 0;
      stack0xfffffffffffffef0 = 0;
      uStack_10b = 0;
      iStack_108 = 0;
      bStack_104 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)local_148,0.0);
      if (0 < (pIVar16->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar19 = 0;
        lVar14 = 0;
        do {
          pNVar1 = (pIVar16->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar18 = &local_48.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar1->val + 1) + lVar19)].m_backend;
          pcVar17 = (cpp_dec_float<100U,_int,_void> *)
                    ((long)(pNVar1->val).m_backend.data._M_elems + lVar19);
          local_198.fpclass = cpp_dec_float_finite;
          local_198.prec_elem = 0x10;
          local_198.data._M_elems[0] = 0;
          local_198.data._M_elems[1] = 0;
          local_198.data._M_elems[2] = 0;
          local_198.data._M_elems[3] = 0;
          local_198.data._M_elems[4] = 0;
          local_198.data._M_elems[5] = 0;
          local_198.data._M_elems[6] = 0;
          local_198.data._M_elems[7] = 0;
          local_198.data._M_elems[8] = 0;
          local_198.data._M_elems[9] = 0;
          local_198.data._M_elems[10] = 0;
          local_198.data._M_elems[0xb] = 0;
          local_198.data._M_elems[0xc] = 0;
          local_198.data._M_elems[0xd] = 0;
          local_198.data._M_elems._56_5_ = 0;
          local_198.data._M_elems[0xf]._1_3_ = 0;
          local_198.exp = 0;
          local_198.neg = false;
          v = pcVar17;
          if ((&local_198 != pcVar18) && (v = pcVar18, pcVar17 != &local_198)) {
            uVar3 = *(undefined8 *)(pcVar17->data)._M_elems;
            uVar4 = *(undefined8 *)((pcVar17->data)._M_elems + 2);
            uVar5 = *(undefined8 *)((pcVar17->data)._M_elems + 4);
            uVar6 = *(undefined8 *)((pcVar17->data)._M_elems + 6);
            uVar7 = *(undefined8 *)((pcVar17->data)._M_elems + 8);
            uVar8 = *(undefined8 *)((pcVar17->data)._M_elems + 10);
            uVar9 = *(undefined8 *)((pcVar17->data)._M_elems + 0xc);
            uVar10 = *(undefined8 *)((pcVar17->data)._M_elems + 0xe);
            local_198.data._M_elems[0xc] = (uint)uVar9;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar10,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar7;
            local_198.data._M_elems[9] = (uint)((ulong)uVar7 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar8;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar5;
            local_198.data._M_elems[5] = (uint)((ulong)uVar5 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar6;
            local_198.data._M_elems[7] = (uint)((ulong)uVar6 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar3;
            local_198.data._M_elems[1] = (uint)((ulong)uVar3 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar4;
            local_198.data._M_elems[3] = (uint)((ulong)uVar4 >> 0x20);
            local_198.exp = *(int *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar19);
            local_198.neg = *(bool *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar19 + 4);
            local_198._72_8_ =
                 *(undefined8 *)((long)(&(pNVar1->val).m_backend.data + 1) + lVar19 + 8);
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_198,v);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    ((cpp_dec_float<100U,_int,_void> *)local_148,&local_198);
          lVar14 = lVar14 + 1;
          lVar19 = lVar19 + 0x54;
        } while (lVar14 < (pIVar16->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      local_198.fpclass = cpp_dec_float_finite;
      local_198.prec_elem = 0x10;
      local_198.data._M_elems[0] = 0;
      local_198.data._M_elems[1] = 0;
      local_198.data._M_elems[2] = 0;
      local_198.data._M_elems[3] = 0;
      local_198.data._M_elems[4] = 0;
      local_198.data._M_elems[5] = 0;
      local_198.data._M_elems[6] = 0;
      local_198.data._M_elems[7] = 0;
      local_198.data._M_elems[8] = 0;
      local_198.data._M_elems[9] = 0;
      local_198.data._M_elems[10] = 0;
      local_198.data._M_elems[0xb] = 0;
      local_198.data._M_elems[0xc] = 0;
      local_198.data._M_elems[0xd] = 0;
      local_198.data._M_elems._56_5_ = 0;
      local_198.data._M_elems[0xf]._1_3_ = 0;
      local_198.exp = 0;
      local_198.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_198,0.0);
      if ((((fpclass_type)local_100 == cpp_dec_float_NaN) ||
          (pnVar2 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pnVar2[lVar15].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_148,&pnVar2[lVar15].m_backend)
         , -1 < iVar12)) {
        if ((((fpclass_type)local_100 != cpp_dec_float_NaN) &&
            (pnVar2 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            pnVar2[lVar15].m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_148,
                                &pnVar2[lVar15].m_backend), 0 < iVar12)) {
          pcVar17 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend;
          local_b0._0_4_ = cpp_dec_float_finite;
          local_b0._4_4_ = 0x10;
          local_f8 = (undefined1  [16])0x0;
          local_e8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          local_c8[0] = 0;
          local_c8[1] = 0;
          stack0xffffffffffffff40 = 0;
          uStack_bb = 0;
          iStack_b8 = 0;
          bStack_b4 = false;
          if ((cpp_dec_float<100U,_int,_void> *)local_f8 == pcVar17) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_f8,
                       (cpp_dec_float<100U,_int,_void> *)local_148);
            if (local_f8._0_4_ != 0 || (fpclass_type)local_b0 != cpp_dec_float_finite) {
              bStack_b4 = (bool)(bStack_b4 ^ 1);
            }
          }
          else {
            local_c8[0] = local_118[0];
            local_c8[1] = local_118[1];
            stack0xffffffffffffff40 = stack0xfffffffffffffef0;
            uStack_bb = uStack_10b;
            local_d8 = local_128;
            local_e8 = local_138;
            local_f8 = local_148;
            iStack_b8 = iStack_108;
            bStack_b4 = bStack_104;
            local_b0._0_4_ = (fpclass_type)local_100;
            local_b0._4_4_ = local_100._4_4_;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_f8,pcVar17);
          }
          local_198.neg = bStack_b4;
          if (bStack_b4 == true) {
            local_198.neg = (fpclass_type)local_b0 == cpp_dec_float_finite && local_f8._0_4_ == 0;
          }
          local_198.data._M_elems[0] = local_f8._0_4_;
          puVar11 = local_f8;
          local_198.exp = iStack_b8;
          local_198._72_8_ = local_b0;
          goto LAB_0039c28d;
        }
      }
      else {
        pcVar17 = &(this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend;
        local_60._0_4_ = cpp_dec_float_finite;
        local_60._4_4_ = 0x10;
        local_a8 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_78[0] = 0;
        local_78[1] = 0;
        stack0xffffffffffffff90 = 0;
        uStack_6b = 0;
        iStack_68 = 0;
        bStack_64 = false;
        if ((cpp_dec_float<100U,_int,_void> *)local_a8 == pcVar17) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_a8,
                     (cpp_dec_float<100U,_int,_void> *)local_148);
          if (local_a8._0_4_ != 0 || (fpclass_type)local_60 != cpp_dec_float_finite) {
            bStack_64 = (bool)(bStack_64 ^ 1);
          }
        }
        else {
          local_78[0] = local_118[0];
          local_78[1] = local_118[1];
          stack0xffffffffffffff90 = stack0xfffffffffffffef0;
          uStack_6b = uStack_10b;
          local_88 = local_128;
          local_98 = local_138;
          local_a8 = local_148;
          iStack_68 = iStack_108;
          bStack_64 = bStack_104;
          local_60._0_4_ = (fpclass_type)local_100;
          local_60._4_4_ = local_100._4_4_;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    ((cpp_dec_float<100U,_int,_void> *)local_a8,pcVar17);
        }
        local_198.neg = bStack_64;
        if (bStack_64 == true) {
          local_198.neg = (fpclass_type)local_60 == cpp_dec_float_finite && local_a8._0_4_ == 0;
        }
        local_198.data._M_elems[0] = local_a8._0_4_;
        puVar11 = local_a8;
        local_198.exp = iStack_68;
        local_198._72_8_ = local_60;
LAB_0039c28d:
        puVar13 = (undefined8 *)(puVar11 + 4);
        local_198.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)(puVar11 + 0x30) >> 0x20);
        local_198.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar11 + 0x38),0);
        local_198.data._M_elems[0xf]._1_3_ =
             (undefined3)((ulong)*(undefined8 *)(puVar11 + 0x38) >> 0x28);
        local_198.data._M_elems[9] = (uint)puVar13[4];
        local_198.data._M_elems[10] = (uint)((ulong)puVar13[4] >> 0x20);
        local_198.data._M_elems[0xb] = (uint)puVar13[5];
        local_198.data._M_elems[0xc] = (uint)((ulong)puVar13[5] >> 0x20);
        local_198.data._M_elems[5] = (uint)puVar13[2];
        local_198.data._M_elems[6] = (uint)((ulong)puVar13[2] >> 0x20);
        local_198.data._M_elems[7] = (uint)puVar13[3];
        local_198.data._M_elems[8] = (uint)((ulong)puVar13[3] >> 0x20);
        local_198.data._M_elems[1] = (uint)*puVar13;
        local_198.data._M_elems[2] = (uint)((ulong)*puVar13 >> 0x20);
        local_198.data._M_elems[3] = (uint)puVar13[1];
        local_198.data._M_elems[4] = (uint)((ulong)puVar13[1] >> 0x20);
      }
      if (((local_198.fpclass != cpp_dec_float_NaN) &&
          ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_198,&maxviol->m_backend), 0 < iVar12)) {
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xc) =
             CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 0xe) =
             CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_);
        *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
             CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 10) =
             CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 4) =
             CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
             CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
        *(ulong *)(maxviol->m_backend).data._M_elems =
             CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
        *(ulong *)((maxviol->m_backend).data._M_elems + 2) =
             CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
        (maxviol->m_backend).exp = local_198.exp;
        (maxviol->m_backend).neg = local_198.neg;
        (maxviol->m_backend).fpclass = local_198.fpclass;
        (maxviol->m_backend).prec_elem = local_198.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (local_50,&local_198);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  if (local_48.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualConstraintViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());

   getPrimalSol(solu);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = 0.0;

      assert(this->lhs(row) <= this->rhs(row) + 1e-9);

      if(val < this->lhs(row))
         viol = spxAbs(val - this->lhs(row));
      else if(val > this->rhs(row))
         viol = spxAbs(val - this->rhs(row));

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}